

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

int __thiscall menuwindow::early_hide_handle(menuwindow *this,int e)

{
  int my;
  menustate *pmVar1;
  menustate *pmVar2;
  int iVar3;
  int iVar4;
  Fl_Menu_Item *pFVar5;
  uint m;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int item;
  int local_3c;
  ulong local_38;
  
  pmVar1 = ::p;
  my = Fl::e_y_root;
  iVar4 = Fl::e_x_root;
  switch(e) {
  case 2:
    if ((Fl::e_is_click != 0) && (::p->state != 1)) {
      if (::p->menubar == 0) {
        return 1;
      }
      if (::p->current_item == (Fl_Menu_Item *)0x0) {
        return 1;
      }
      if ((::p->current_item->flags & 0x60) != 0) {
        return 1;
      }
    }
    if ((::p->current_item != (Fl_Menu_Item *)0x0) && ((::p->current_item->flags & 0x11) != 0)) {
      return 1;
    }
    break;
  case 8:
    if (0xff1a < Fl::e_keysym) {
      switch(Fl::e_keysym) {
      case 0xff51:
        if ((::p->menubar != 0) && (::p->menu_number < 2)) {
          backward(0);
          return 1;
        }
        if (0 < ::p->menu_number) {
          m = ::p->menu_number - 1;
          setitem(m,::p->p[m]->selected);
          return 1;
        }
        return 1;
      case 0xff52:
        if ((::p->menubar != 0) && (::p->menu_number == 0)) {
          return 1;
        }
        iVar4 = backward(::p->menu_number);
        pmVar2 = ::p;
        if (iVar4 != 0) {
          return 1;
        }
        if (pmVar1->menubar != 0) {
          if (pmVar1->menu_number == 1) {
            iVar4 = pmVar1->p[0]->selected;
            if (iVar4 < 0) {
              pFVar5 = (Fl_Menu_Item *)0x0;
            }
            else {
              pFVar5 = Fl_Menu_Item::next(::p->p[0]->menu,iVar4);
            }
            pmVar2->current_item = pFVar5;
            pmVar2->menu_number = 0;
            pmVar2->item_number = iVar4;
            return 1;
          }
          return 1;
        }
        return 1;
      case 0xff53:
        if ((::p->menubar != 0) &&
           ((::p->menu_number < 1 || ((::p->menu_number == 1 && (::p->nummenus == 2)))))) {
          forward(0);
          return 1;
        }
        if (::p->nummenus + -1 <= ::p->menu_number) {
          return 1;
        }
        iVar4 = ::p->menu_number + 1;
        goto LAB_001bf257;
      case 0xff54:
        goto switchD_001beff1_caseD_ff54;
      default:
        if (Fl::e_keysym == 0xff1b) {
          ::p->current_item = (Fl_Menu_Item *)0x0;
          pmVar1->menu_number = -1;
          pmVar1->item_number = 0;
        }
        else if (Fl::e_keysym != 0xff8d) goto switchD_001bed3e_caseD_4;
        goto LAB_001bf1d3;
      }
    }
    if (0xff08 < Fl::e_keysym) {
      if (Fl::e_keysym != 0xff09) {
        if (Fl::e_keysym != 0xff0d) goto switchD_001bed3e_caseD_4;
        break;
      }
      if ((Fl::e_state._2_1_ & 1) != 0) goto LAB_001bf0eb;
switchD_001beff1_caseD_ff54:
      if ((::p->menu_number == 0) && (::p->menubar != 0)) {
        if (::p->nummenus < 2) {
          return 1;
        }
        iVar4 = 1;
      }
      else {
        iVar4 = forward(::p->menu_number);
        if (iVar4 != 0) {
          return 1;
        }
        if (Fl::e_keysym != 0xff09) {
          return 1;
        }
        pmVar1->item_number = -1;
        iVar4 = pmVar1->menu_number;
      }
LAB_001bf257:
      forward(iVar4);
      return 1;
    }
    if (Fl::e_keysym != 0x20) {
      if (Fl::e_keysym == 0xff08) {
LAB_001bf0eb:
        iVar4 = backward(::p->menu_number);
        if (iVar4 == 0) {
          pmVar1->item_number = -1;
          backward(pmVar1->menu_number);
          return 1;
        }
        return 1;
      }
      goto switchD_001bed3e_caseD_4;
    }
    break;
  case 0xb:
    if (::p->state == 2) {
      return 1;
    }
  case 1:
  case 3:
  case 5:
    if (::p->nummenus != 1 || ::p->menubar == 0) {
      uVar7 = (ulong)(uint)::p->nummenus;
      do {
        iVar6 = (int)uVar7;
        if (iVar6 < 1) goto LAB_001bee40;
        lVar8 = uVar7 - 1;
        uVar7 = uVar7 - 1;
        iVar3 = is_inside(pmVar1->p[lVar8],iVar4,my);
      } while (iVar3 == 0);
      if (iVar6 < 1) {
LAB_001bee40:
        pmVar2 = ::p;
        ::p->current_item = (Fl_Menu_Item *)0x0;
        pmVar2->menu_number = -1;
        pmVar2->item_number = 0;
        if (e == 1) {
          pmVar1->state = 2;
          return 1;
        }
        return 1;
      }
    }
    iVar6 = pmVar1->nummenus;
    lVar8 = (long)iVar6 + 1;
    local_38 = (ulong)(uint)e;
    do {
      iVar6 = iVar6 + -1;
      iVar3 = find_selected(pmVar1->p[lVar8 + -2],iVar4,my);
      pmVar2 = ::p;
      if (-1 < iVar3) {
        iVar4 = iVar3 - (uint)(iVar3 != 0 && my == 0);
        pFVar5 = Fl_Menu_Item::next(::p->p[lVar8 + -2]->menu,iVar4);
        pmVar2->current_item = pFVar5;
        pmVar2->menu_number = iVar6;
        pmVar2->item_number = iVar4;
        if ((int)local_38 != 1) {
          return 1;
        }
        pFVar5 = pmVar1->current_item;
        if ((((pFVar5 != (Fl_Menu_Item *)0x0) && ((pFVar5->flags & 0x60) != 0)) &&
            (iVar3 != pmVar1->p[lVar8 + -2]->selected)) && (pFVar5->callback_ == (Fl_Callback *)0x0)
           ) {
          pmVar1->state = 3;
          return 1;
        }
        pmVar1->state = 1;
        return 1;
      }
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
    if ((int)local_38 != 1 || pmVar1->menu_number != -1) {
      if (pmVar1->menu_number != 0 || pmVar1->current_item == (Fl_Menu_Item *)0x0) {
        return 0;
      }
      if ((pmVar1->current_item->flags & 0x60) == 0) {
        if ((int)local_38 == 1) {
          pmVar1->state = 2;
        }
        pmVar1 = ::p;
        ::p->current_item = (Fl_Menu_Item *)0x0;
        pmVar1->menu_number = -1;
        pmVar1->item_number = 0;
        return 1;
      }
      return 0;
    }
    break;
  case 0xc:
    iVar4 = ::p->nummenus;
    lVar8 = (long)iVar4;
    if (lVar8 != 0) {
      do {
        iVar4 = iVar4 + -1;
        pFVar5 = Fl_Menu_Item::find_shortcut(pmVar1->p[lVar8 + -1]->menu,&local_3c,false);
        pmVar2 = ::p;
        if (pFVar5 != (Fl_Menu_Item *)0x0) {
          ::p->current_item = pFVar5;
          pmVar2->menu_number = iVar4;
          pmVar2->item_number = local_3c;
          if ((pFVar5->flags & 0x60) != 0) {
            return 1;
          }
          goto LAB_001bf1d3;
        }
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
  default:
switchD_001bed3e_caseD_4:
    iVar4 = Fl_Window::handle((Fl_Window *)this,e);
    return iVar4;
  }
LAB_001bf1d3:
  pmVar1->state = 2;
  return 1;
}

Assistant:

int menuwindow::early_hide_handle(int e) {
#endif
  menustate &pp = *p;
  switch (e) {
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_BackSpace:
    BACKTAB:
      if (!backward(pp.menu_number)) {pp.item_number = -1;backward(pp.menu_number);}
      return 1;
    case FL_Up:
      if (pp.menubar && pp.menu_number == 0) {
        // Do nothing...
      } else if (backward(pp.menu_number)) {
        // Do nothing...
      } else if (pp.menubar && pp.menu_number==1) {
        setitem(0, pp.p[0]->selected);
      }
      return 1;
    case FL_Tab:
      if (Fl::event_shift()) goto BACKTAB;
    case FL_Down:
      if (pp.menu_number || !pp.menubar) {
        if (!forward(pp.menu_number) && Fl::event_key()==FL_Tab) {
          pp.item_number = -1;
          forward(pp.menu_number);
        }
      } else if (pp.menu_number < pp.nummenus-1) {
        forward(pp.menu_number+1);
      }
      return 1;
    case FL_Right:
      if (pp.menubar && (pp.menu_number<=0 || (pp.menu_number==1 && pp.nummenus==2)))
	forward(0);
      else if (pp.menu_number < pp.nummenus-1) forward(pp.menu_number+1);
      return 1;
    case FL_Left:
      if (pp.menubar && pp.menu_number<=1) backward(0);
      else if (pp.menu_number>0)
	setitem(pp.menu_number-1, pp.p[pp.menu_number-1]->selected);
      return 1;
    case FL_Enter:
    case FL_KP_Enter:
    case ' ':
      pp.state = DONE_STATE;
      return 1;
    case FL_Escape:
      setitem(0, -1, 0);
      pp.state = DONE_STATE;
      return 1;
    }
    break;
  case FL_SHORTCUT: 
    {
      for (int mymenu = pp.nummenus; mymenu--;) {
	menuwindow &mw = *(pp.p[mymenu]);
	int item; const Fl_Menu_Item* m = mw.menu->find_shortcut(&item);
	if (m) {
	  setitem(m, mymenu, item);
	  if (!m->submenu()) pp.state = DONE_STATE;
	  return 1;
	}
      }
    }
    break;
    case FL_MOVE:
#if ! (defined(WIN32) || defined(__APPLE__))
      if (pp.state == DONE_STATE) {
	return 1; // Fix for STR #2619
      }
      /* FALLTHROUGH */
#endif
  case FL_ENTER:
  case FL_PUSH:
  case FL_DRAG:
    {
      int mx = Fl::event_x_root();
      int my = Fl::event_y_root();
      int item=0; int mymenu = pp.nummenus-1;
      // Clicking or dragging outside menu cancels it...
      if ((!pp.menubar || mymenu) && !pp.is_inside(mx, my)) {
	setitem(0, -1, 0);
	if (e==FL_PUSH)
	  pp.state = DONE_STATE;
	return 1;
      }
      for (mymenu = pp.nummenus-1; ; mymenu--) {
	item = pp.p[mymenu]->find_selected(mx, my);
	if (item >= 0) 
	  break;
	if (mymenu <= 0) {
	  // buttons in menubars must be deselected if we move outside of them!
	  if (pp.menu_number==-1 && e==FL_PUSH) {
	    pp.state = DONE_STATE;
	    return 1;
	  }
	  if (pp.current_item && pp.menu_number==0 && !pp.current_item->submenu()) {
	    if (e==FL_PUSH)
	      pp.state = DONE_STATE;
	    setitem(0, -1, 0);
	    return 1;
	  }
	  // all others can stay selected
	  return 0;
	}
      }
      if (my == 0 && item > 0) setitem(mymenu, item - 1);
      else setitem(mymenu, item);
      if (e == FL_PUSH) {
	if (pp.current_item && pp.current_item->submenu() // this is a menu title
	    && item != pp.p[mymenu]->selected // and it is not already on
	    && !pp.current_item->callback_) // and it does not have a callback
	  pp.state = MENU_PUSH_STATE;
	else
	  pp.state = PUSH_STATE;
      }
    }
    return 1;
  case FL_RELEASE:
    // Mouse must either be held down/dragged some, or this must be
    // the second click (not the one that popped up the menu):
    if (   !Fl::event_is_click() 
        || pp.state == PUSH_STATE 
        || (pp.menubar && pp.current_item && !pp.current_item->submenu()) // button
	) {
#if 0 // makes the check/radio items leave the menu up
      const Fl_Menu_Item* m = pp.current_item;
      if (m && button && (m->flags & (FL_MENU_TOGGLE|FL_MENU_RADIO))) {
	((Fl_Menu_*)button)->picked(m);
	pp.p[pp.menu_number]->redraw();
      } else
#endif
      // do nothing if they try to pick inactive items
      if (!pp.current_item || pp.current_item->activevisible())
	pp.state = DONE_STATE;
    }
    return 1;
  }
  return Fl_Window::handle(e);
}